

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkCreateLevelsRev(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Wlc_Obj_t *pWVar3;
  int local_2c;
  int LevelMax;
  int Level;
  int iFanin;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  local_2c = 0;
  iVar1 = Wlc_NtkObjNumMax(p);
  Vec_IntFill(&p->vLevels,iVar1,0);
  iFanin = Wlc_NtkObjNumMax(p);
  while (iFanin = iFanin + -1, 0 < iFanin) {
    pWVar3 = Wlc_NtkObj(p,iFanin);
    iVar1 = Wlc_ObjIsCi(pWVar3);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjLevel(p,pWVar3);
      for (Level = 0; iVar2 = Wlc_ObjFaninNum(pWVar3), Level < iVar2; Level = Level + 1) {
        iVar2 = Wlc_ObjFaninId(pWVar3,Level);
        Vec_IntUpdateEntry(&p->vLevels,iVar2,iVar1 + 1);
      }
      local_2c = Abc_MaxInt(local_2c,iVar1 + 1);
    }
  }
  for (iFanin = 1; iVar1 = Wlc_NtkObjNumMax(p), iFanin < iVar1; iFanin = iFanin + 1) {
    Wlc_NtkObj(p,iFanin);
    iVar1 = Wlc_ObjLevelId(p,iFanin);
    Vec_IntWriteEntry(&p->vLevels,iFanin,local_2c - iVar1);
  }
  for (iFanin = 0; iVar1 = Wlc_NtkCiNum(p), iFanin < iVar1; iFanin = iFanin + 1) {
    pWVar3 = Wlc_NtkCi(p,iFanin);
    iVar1 = Wlc_ObjId(p,pWVar3);
    Vec_IntWriteEntry(&p->vLevels,iVar1,0);
  }
  return local_2c;
}

Assistant:

int Wlc_NtkCreateLevelsRev( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, Level, LevelMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObjReverse( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) )
            continue;
        Level = Wlc_ObjLevel(p, pObj) + 1;
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntUpdateEntry( &p->vLevels, iFanin, Level );
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    // reverse the values
    Wlc_NtkForEachObj( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, i, LevelMax - Wlc_ObjLevelId(p, i) );
    Wlc_NtkForEachCi( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), 0 );
    //Wlc_NtkForEachObj( p, pObj, i )
    //    printf( "%d -> %d\n", i, Wlc_ObjLevelId(p, i) );
    return LevelMax;
}